

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O0

void __thiscall Centaurus::GrammarOptions::parse(GrammarOptions *this,Stream *stream)

{
  wchar_t wVar1;
  StreamException *pSVar2;
  wstring *__args_1;
  undefined1 local_80 [8];
  Identifier value;
  Identifier key;
  wchar_t ch;
  Stream *stream_local;
  GrammarOptions *this_local;
  
  wVar1 = Stream::skip_whitespace(stream);
  if (wVar1 != L'{') {
    pSVar2 = (StreamException *)__cxa_allocate_exception(0x28);
    Stream::unexpected(pSVar2,stream,wVar1);
    __cxa_throw(pSVar2,&StreamException::typeinfo,StreamException::~StreamException);
  }
  Stream::discard(stream);
  while( true ) {
    Identifier::Identifier((Identifier *)((long)&value.m_id.field_2 + 8),stream);
    wVar1 = Stream::skip_whitespace(stream);
    if (wVar1 != L'=') {
      pSVar2 = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::unexpected(pSVar2,stream,wVar1);
      __cxa_throw(pSVar2,&StreamException::typeinfo,StreamException::~StreamException);
    }
    Stream::discard(stream);
    Identifier::Identifier((Identifier *)local_80,stream);
    wVar1 = Stream::skip_whitespace(stream);
    if (wVar1 != L';') break;
    Stream::discard(stream);
    __args_1 = Identifier::str_abi_cxx11_((Identifier *)local_80);
    std::
    unordered_map<Centaurus::Identifier,std::__cxx11::wstring,std::hash<Centaurus::Identifier>,std::equal_to<Centaurus::Identifier>,std::allocator<std::pair<Centaurus::Identifier_const,std::__cxx11::wstring>>>
    ::emplace<Centaurus::Identifier&,std::__cxx11::wstring_const&>
              ((unordered_map<Centaurus::Identifier,std::__cxx11::wstring,std::hash<Centaurus::Identifier>,std::equal_to<Centaurus::Identifier>,std::allocator<std::pair<Centaurus::Identifier_const,std::__cxx11::wstring>>>
                *)&this->
                   super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
               ,(Identifier *)((long)&value.m_id.field_2 + 8),__args_1);
    Identifier::~Identifier((Identifier *)local_80);
    Identifier::~Identifier((Identifier *)((long)&value.m_id.field_2 + 8));
  }
  pSVar2 = (StreamException *)__cxa_allocate_exception(0x28);
  Stream::unexpected(pSVar2,stream,wVar1);
  __cxa_throw(pSVar2,&StreamException::typeinfo,StreamException::~StreamException);
}

Assistant:

void GrammarOptions::parse(Stream& stream)
{
    wchar_t ch = stream.skip_whitespace();
    if (ch != L'{')
        throw stream.unexpected(ch);
    stream.discard();

    while (true)
    {
        Identifier key(stream);

        ch = stream.skip_whitespace();
        if (ch != L'=')
            throw stream.unexpected(ch);
        stream.discard();

        Identifier value(stream);

        ch = stream.skip_whitespace();
        if (ch != L';')
            throw stream.unexpected(ch);
        stream.discard();

        emplace(key, value.str());
    }

    ch = stream.skip_whitespace();
    if (ch != L'}')
        throw stream.unexpected(ch);
    stream.discard();
}